

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidTimingControl * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
          (BumpAllocator *this,TimingControl **args)

{
  InvalidTimingControl *pIVar1;
  TimingControl *in_RDI;
  InvalidTimingControl *unaff_retaddr;
  
  pIVar1 = (InvalidTimingControl *)
           allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  ast::InvalidTimingControl::InvalidTimingControl(unaff_retaddr,in_RDI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }